

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_snap.c
# Opt level: O2

void lj_snap_add(jit_State *J)

{
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  SnapEntry *pSVar6;
  IRIns *pIVar7;
  TValue *pTVar8;
  uint uVar9;
  TValue *pTVar10;
  ulong uVar11;
  TValue *pTVar12;
  uint uVar13;
  SnapEntry SVar14;
  uint uVar15;
  ulong uVar16;
  uint uVar17;
  int iVar18;
  SnapShot *pSVar19;
  
  uVar1 = (J->cur).nsnap;
  uVar11 = (ulong)uVar1;
  uVar3 = (J->cur).nsnapmap;
  uVar9 = (uint)uVar1;
  if (((uVar1 != 0) && ((J->cur).nins == (uint)(J->cur).snap[uVar11 - 1].ref)) ||
     ((J->mergesnap != '\0' && (-1 < (char)(J->guardemit).irt)))) {
    if (uVar9 != 1) {
      pSVar19 = (J->cur).snap;
      uVar11 = (ulong)(uVar9 - 1);
      uVar3 = pSVar19[uVar11].mapofs;
      goto LAB_00140410;
    }
    (J->fold).ins.field_0.ot = 0xc00;
    (J->fold).ins.field_1.op12 = 0;
    lj_ir_emit(J);
  }
  if (J->sizesnap <= uVar9) {
    lj_snap_grow_buf_(J,uVar1 + 1);
  }
  (J->cur).nsnap = (uint16_t)(uVar1 + 1);
  pSVar19 = (J->cur).snap;
LAB_00140410:
  iVar18 = 0;
  J->mergesnap = '\0';
  (J->guardemit).irt = '\0';
  uVar17 = J->maxslot + J->baseslot;
  uVar9 = J->framedepth + uVar3 + uVar17 + 1;
  if (J->sizesnapmap < uVar9) {
    lj_snap_grow_map_(J,uVar9);
  }
  pSVar19 = pSVar19 + uVar11;
  pSVar6 = (J->cur).snapmap;
  uVar1 = J->chain[0xb];
  uVar9 = 0;
  for (uVar11 = 0; uVar17 != uVar11; uVar11 = uVar11 + 1) {
    uVar4 = J->slot[uVar11];
    uVar16 = (ulong)(uVar4 & 0xffff);
    if (uVar16 != 0) {
      SVar14 = (uVar4 & 0x3ffff) + iVar18;
      if (((((uVar4 & 0x30000) == 0) &&
           (pIVar7 = (J->cur).ir, *(char *)((long)pIVar7 + uVar16 * 8 + 5) == 'F')) &&
          (uVar11 == pIVar7[uVar16].field_0.op1)) && ((uint)uVar1 < (uVar4 & 0xffff))) {
        uVar2 = *(ushort *)((long)pIVar7 + uVar16 * 8 + 2);
        if ((uVar2 & 0x20) == 0) goto LAB_001404dd;
        if ((uVar2 & 0x11) != 1) {
          SVar14 = iVar18 + 0x40000 + (uVar4 & 0x3ffff);
        }
      }
      pSVar6[(ulong)uVar3 + (ulong)uVar9] = SVar14;
      uVar9 = uVar9 + 1;
    }
LAB_001404dd:
    iVar18 = iVar18 + 0x1000000;
  }
  pSVar19->nent = (uint8_t)uVar9;
  pSVar6 = pSVar6 + (ulong)uVar3 + (ulong)uVar9;
  pTVar8 = J->L->base;
  pTVar10 = pTVar8 + -1;
  uVar4 = J->baseslot;
  if (*(char *)((ulong)pTVar8[-1].u32.lo + 6) == '\0') {
    pTVar12 = pTVar10 + *(byte *)((ulong)*(uint *)((ulong)pTVar8[-1].u32.lo + 0x10) - 0x39);
  }
  else {
    pTVar12 = J->L->top;
  }
  *pSVar6 = *(SnapEntry *)&J->pc;
  uVar13 = 1;
  do {
    while( true ) {
      if (pTVar10 <= pTVar8 + -(ulong)uVar4) {
        pSVar19->topslot = (uint8_t)((uint)((int)pTVar12 - (int)(pTVar8 + -(ulong)uVar4)) >> 3);
        pSVar19->mapofs = uVar3;
        pSVar19->ref = (IRRef1)(J->cur).nins;
        pSVar19->mcofs = 0;
        pSVar19->nslots = (uint8_t)uVar17;
        pSVar19->count = '\0';
        (J->cur).nsnapmap = uVar9 + uVar3 + uVar13;
        return;
      }
      uVar5 = (pTVar10->field_2).it;
      if ((uVar5 & 3) != 0) break;
      uVar15 = uVar13 + 1;
      pSVar6[uVar13] = uVar5;
      pTVar10 = pTVar10 + (-1 - (ulong)*(byte *)((ulong)(pTVar10->field_2).it - 3));
LAB_001405a4:
      uVar13 = uVar15;
      if (pTVar12 < pTVar10 + *(byte *)((ulong)*(uint *)((ulong)(pTVar10->u32).lo + 0x10) - 0x39)) {
        pTVar12 = pTVar10 + *(byte *)((ulong)*(uint *)((ulong)(pTVar10->u32).lo + 0x10) - 0x39);
      }
    }
    pSVar6[uVar13] = uVar5;
    if ((uVar5 & 7) == 2) {
      uVar15 = uVar13 + 2;
      pSVar6[uVar13 + 1] = *(SnapEntry *)((long)pTVar10 - 4);
      pTVar10 = (TValue *)((long)pTVar10 - ((long)(int)(pTVar10->field_2).it & 0xfffffffffffffff8U))
      ;
      goto LAB_001405a4;
    }
    pTVar10 = (TValue *)((long)pTVar10 - ((long)(int)(pTVar10->field_2).it & 0xfffffffffffffff8U));
    uVar13 = uVar13 + 1;
  } while( true );
}

Assistant:

void lj_snap_add(jit_State *J)
{
  MSize nsnap = J->cur.nsnap;
  MSize nsnapmap = J->cur.nsnapmap;
  /* Merge if no ins. inbetween or if requested and no guard inbetween. */
  if ((nsnap > 0 && J->cur.snap[nsnap-1].ref == J->cur.nins) ||
      (J->mergesnap && !irt_isguard(J->guardemit))) {
    if (nsnap == 1) {  /* But preserve snap #0 PC. */
      emitir_raw(IRT(IR_NOP, IRT_NIL), 0, 0);
      goto nomerge;
    }
    nsnapmap = J->cur.snap[--nsnap].mapofs;
  } else {
  nomerge:
    lj_snap_grow_buf(J, nsnap+1);
    J->cur.nsnap = (uint16_t)(nsnap+1);
  }
  J->mergesnap = 0;
  J->guardemit.irt = 0;
  snapshot_stack(J, &J->cur.snap[nsnap], nsnapmap);
}